

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chachapoly.c
# Opt level: O0

int mbedtls_chachapoly_finish(mbedtls_chachapoly_context *ctx,uchar *mac)

{
  int iVar1;
  uchar local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  uchar len_block [16];
  int ret;
  uchar *mac_local;
  mbedtls_chachapoly_context *ctx_local;
  
  len_block[0xc] = 0x92;
  len_block[0xd] = 0xff;
  len_block[0xe] = 0xff;
  len_block[0xf] = 0xff;
  if (ctx->state == 0) {
    ctx_local._4_4_ = -0x54;
  }
  else {
    if (ctx->state == 1) {
      iVar1 = chachapoly_pad_aad(ctx);
      if (iVar1 != 0) {
        return iVar1;
      }
      len_block[0xc] = '\0';
      len_block[0xd] = '\0';
      len_block[0xe] = '\0';
      len_block[0xf] = '\0';
    }
    else if (ctx->state == 2) {
      iVar1 = chachapoly_pad_ciphertext(ctx);
      if (iVar1 != 0) {
        return iVar1;
      }
      len_block[0xc] = '\0';
      len_block[0xd] = '\0';
      len_block[0xe] = '\0';
      len_block[0xf] = '\0';
    }
    ctx->state = 3;
    local_38 = (uchar)ctx->aad_len;
    local_37 = (undefined1)(ctx->aad_len >> 8);
    local_36 = (undefined1)(ctx->aad_len >> 0x10);
    local_35 = (undefined1)(ctx->aad_len >> 0x18);
    local_34 = (undefined1)(ctx->aad_len >> 0x20);
    local_33 = (undefined1)(ctx->aad_len >> 0x28);
    local_32 = (undefined1)(ctx->aad_len >> 0x30);
    local_31 = (undefined1)(ctx->aad_len >> 0x38);
    len_block[0] = (uchar)ctx->ciphertext_len;
    len_block[1] = (uchar)(ctx->ciphertext_len >> 8);
    len_block[2] = (uchar)(ctx->ciphertext_len >> 0x10);
    len_block[3] = (uchar)(ctx->ciphertext_len >> 0x18);
    len_block[4] = (uchar)(ctx->ciphertext_len >> 0x20);
    len_block[5] = (uchar)(ctx->ciphertext_len >> 0x28);
    len_block[6] = (uchar)(ctx->ciphertext_len >> 0x30);
    len_block[7] = (uchar)(ctx->ciphertext_len >> 0x38);
    len_block._12_4_ = mbedtls_poly1305_update(&ctx->poly1305_ctx,&local_38,0x10);
    ctx_local._4_4_ = len_block._12_4_;
    if (len_block._12_4_ == 0) {
      ctx_local._4_4_ = mbedtls_poly1305_finish(&ctx->poly1305_ctx,mac);
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_chachapoly_finish( mbedtls_chachapoly_context *ctx,
                               unsigned char mac[16] )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char len_block[16];
    CHACHAPOLY_VALIDATE_RET( ctx != NULL );
    CHACHAPOLY_VALIDATE_RET( mac != NULL );

    if( ctx->state == CHACHAPOLY_STATE_INIT )
    {
        return( MBEDTLS_ERR_CHACHAPOLY_BAD_STATE );
    }

    if( ctx->state == CHACHAPOLY_STATE_AAD )
    {
        ret = chachapoly_pad_aad( ctx );
        if( ret != 0 )
            return( ret );
    }
    else if( ctx->state == CHACHAPOLY_STATE_CIPHERTEXT )
    {
        ret = chachapoly_pad_ciphertext( ctx );
        if( ret != 0 )
            return( ret );
    }

    ctx->state = CHACHAPOLY_STATE_FINISHED;

    /* The lengths of the AAD and ciphertext are processed by
     * Poly1305 as the final 128-bit block, encoded as little-endian integers.
     */
    len_block[ 0] = (unsigned char)( ctx->aad_len       );
    len_block[ 1] = (unsigned char)( ctx->aad_len >>  8 );
    len_block[ 2] = (unsigned char)( ctx->aad_len >> 16 );
    len_block[ 3] = (unsigned char)( ctx->aad_len >> 24 );
    len_block[ 4] = (unsigned char)( ctx->aad_len >> 32 );
    len_block[ 5] = (unsigned char)( ctx->aad_len >> 40 );
    len_block[ 6] = (unsigned char)( ctx->aad_len >> 48 );
    len_block[ 7] = (unsigned char)( ctx->aad_len >> 56 );
    len_block[ 8] = (unsigned char)( ctx->ciphertext_len       );
    len_block[ 9] = (unsigned char)( ctx->ciphertext_len >>  8 );
    len_block[10] = (unsigned char)( ctx->ciphertext_len >> 16 );
    len_block[11] = (unsigned char)( ctx->ciphertext_len >> 24 );
    len_block[12] = (unsigned char)( ctx->ciphertext_len >> 32 );
    len_block[13] = (unsigned char)( ctx->ciphertext_len >> 40 );
    len_block[14] = (unsigned char)( ctx->ciphertext_len >> 48 );
    len_block[15] = (unsigned char)( ctx->ciphertext_len >> 56 );

    ret = mbedtls_poly1305_update( &ctx->poly1305_ctx, len_block, 16U );
    if( ret != 0 )
        return( ret );

    ret = mbedtls_poly1305_finish( &ctx->poly1305_ctx, mac );

    return( ret );
}